

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerThreadManager.cxx
# Opt level: O1

optional<dap::StackTraceResponse> * __thiscall
cmDebugger::cmDebuggerThreadManager::GetThreadStackTraceResponse
          (optional<dap::StackTraceResponse> *__return_storage_ptr__,cmDebuggerThreadManager *this,
          int64_t id)

{
  _List_node_base *p_Var1;
  StackTraceResponse local_38;
  
  p_Var1 = (_List_node_base *)this;
  do {
    p_Var1 = (((list<std::shared_ptr<cmDebugger::cmDebuggerThread>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerThread>_>_>
                *)&p_Var1->_M_next)->
             super__List_base<std::shared_ptr<cmDebugger::cmDebuggerThread>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerThread>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)this) break;
  } while (**(long **)(p_Var1 + 1) != id);
  if (p_Var1 == (_List_node_base *)this) {
    (__return_storage_ptr__->super__Optional_base<dap::StackTraceResponse,_false,_false>)._M_payload
    .super__Optional_payload<dap::StackTraceResponse,_true,_false,_false>.
    super__Optional_payload_base<dap::StackTraceResponse>._M_engaged = false;
  }
  else {
    GetStackTraceResponse(&local_38,(shared_ptr<cmDebugger::cmDebuggerThread> *)(p_Var1 + 1));
    *(pointer *)
     &(__return_storage_ptr__->super__Optional_base<dap::StackTraceResponse,_false,_false>).
      _M_payload.super__Optional_payload<dap::StackTraceResponse,_true,_false,_false>.
      super__Optional_payload_base<dap::StackTraceResponse>._M_payload._M_value.stackFrames.
      super__Vector_base<dap::StackFrame,_std::allocator<dap::StackFrame>_> =
         local_38.stackFrames.super__Vector_base<dap::StackFrame,_std::allocator<dap::StackFrame>_>.
         _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->super__Optional_base<dap::StackTraceResponse,_false,_false>).
             _M_payload.super__Optional_payload<dap::StackTraceResponse,_true,_false,_false>.
             super__Optional_payload_base<dap::StackTraceResponse>._M_payload._M_value.stackFrames.
             super__Vector_base<dap::StackFrame,_std::allocator<dap::StackFrame>_> + 8) =
         local_38.stackFrames.super__Vector_base<dap::StackFrame,_std::allocator<dap::StackFrame>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->super__Optional_base<dap::StackTraceResponse,_false,_false>).
             _M_payload.super__Optional_payload<dap::StackTraceResponse,_true,_false,_false>.
             super__Optional_payload_base<dap::StackTraceResponse>._M_payload._M_value.stackFrames.
             super__Vector_base<dap::StackFrame,_std::allocator<dap::StackFrame>_> + 0x10) =
         local_38.stackFrames.super__Vector_base<dap::StackFrame,_std::allocator<dap::StackFrame>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_38.stackFrames.super__Vector_base<dap::StackFrame,_std::allocator<dap::StackFrame>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.stackFrames.super__Vector_base<dap::StackFrame,_std::allocator<dap::StackFrame>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.stackFrames.super__Vector_base<dap::StackFrame,_std::allocator<dap::StackFrame>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Optional_base<dap::StackTraceResponse,_false,_false>)._M_payload
    .super__Optional_payload<dap::StackTraceResponse,_true,_false,_false>.
    super__Optional_payload_base<dap::StackTraceResponse>._M_payload._M_value.totalFrames.val.val =
         local_38.totalFrames.val.val;
    *(bool *)((long)&(__return_storage_ptr__->
                     super__Optional_base<dap::StackTraceResponse,_false,_false>)._M_payload.
                     super__Optional_payload<dap::StackTraceResponse,_true,_false,_false>.
                     super__Optional_payload_base<dap::StackTraceResponse>._M_payload + 0x20) =
         local_38.totalFrames.set;
    (__return_storage_ptr__->super__Optional_base<dap::StackTraceResponse,_false,_false>)._M_payload
    .super__Optional_payload<dap::StackTraceResponse,_true,_false,_false>.
    super__Optional_payload_base<dap::StackTraceResponse>._M_engaged = true;
    std::vector<dap::StackFrame,_std::allocator<dap::StackFrame>_>::~vector(&local_38.stackFrames);
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<dap::StackTraceResponse>
cmDebuggerThreadManager::GetThreadStackTraceResponse(int64_t id)
{
  auto it = find_if(Threads.begin(), Threads.end(),
                    [&](const std::shared_ptr<cmDebuggerThread>& t) {
                      return t->GetId() == id;
                    });

  if (it == Threads.end()) {
    return {};
  }

  return GetStackTraceResponse(*it);
}